

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O3

Aig_Obj_t * Saig_ManGetLabeledRegister_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  Aig_Obj_t **ppAVar4;
  
  iVar1 = p->nTravIds;
  if (pObj->TravId != iVar1) {
    do {
      pObj->TravId = iVar1;
      uVar3 = (uint)*(ulong *)&pObj->field_0x18;
      if ((uVar3 & 7) == 2) {
        if ((pObj->field_0).CioId < p->nTruePis) {
          return (Aig_Obj_t *)0x0;
        }
        if ((*(ulong *)&pObj->field_0x18 & 0x30) != 0) {
          return pObj;
        }
        uVar3 = ((pObj->field_0).CioId - p->nTruePis) + p->nTruePos;
        if (((int)uVar3 < 0) || (p->vCos->nSize <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        ppAVar4 = (Aig_Obj_t **)((long)p->vCos->pArray[uVar3] + 8);
      }
      else {
        if ((uVar3 & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                        ,0x375,"Aig_Obj_t *Saig_ManGetLabeledRegister_rec(Aig_Man_t *, Aig_Obj_t *)"
                       );
        }
        pAVar2 = Saig_ManGetLabeledRegister_rec
                           (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
        if (pAVar2 != (Aig_Obj_t *)0x0) {
          return pAVar2;
        }
        ppAVar4 = &pObj->pFanin1;
        iVar1 = p->nTravIds;
      }
      pObj = (Aig_Obj_t *)((ulong)*ppAVar4 & 0xfffffffffffffffe);
    } while (pObj->TravId != iVar1);
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

Aig_Obj_t * Saig_ManGetLabeledRegister_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pResult;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return NULL;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Saig_ObjIsPi(p, pObj) )
        return NULL;
    if ( Saig_ObjIsLo(p, pObj) )
    {
        if ( pObj->fMarkA || pObj->fMarkB )
            return pObj;
        return Saig_ManGetLabeledRegister_rec( p, Aig_ObjFanin0( Saig_ObjLoToLi(p, pObj) ) );
    }
    assert( Aig_ObjIsNode(pObj) );
    pResult = Saig_ManGetLabeledRegister_rec( p, Aig_ObjFanin0(pObj) );
    if ( pResult )
        return pResult;
    return Saig_ManGetLabeledRegister_rec( p, Aig_ObjFanin1(pObj) );
}